

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O3

GeometryShaderOutputType sglr::rr_util::mapGLGeometryShaderOutputType(deUint32 primitive)

{
  GeometryShaderOutputType GVar1;
  
  GVar1 = GEOMETRYSHADEROUTPUTTYPE_LAST;
  if (primitive < 6) {
    GVar1 = *(GeometryShaderOutputType *)(&DAT_0067258c + (ulong)primitive * 4);
  }
  return GVar1;
}

Assistant:

rr::GeometryShaderOutputType mapGLGeometryShaderOutputType (deUint32 primitive)
{
	switch (primitive)
	{
		case GL_POINTS:				return rr::GEOMETRYSHADEROUTPUTTYPE_POINTS;
		case GL_LINE_STRIP:			return rr::GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP;
		case GL_TRIANGLE_STRIP:		return rr::GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP;
		default:
			DE_ASSERT(DE_FALSE);
			return rr::GEOMETRYSHADEROUTPUTTYPE_LAST;
	}
}